

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O3

stack<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
* __thiscall
duckdb::ColumnDependencyManager::GetBindOrder
          (stack<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
           *__return_storage_ptr__,ColumnDependencyManager *this,ColumnList *columns)

{
  _Elt_pointer pLVar1;
  pointer pCVar2;
  bool bVar3;
  __node_base_ptr p_Var4;
  mapped_type *pmVar5;
  ColumnDefinition *this_00;
  size_type sVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  idx_t iVar9;
  ColumnListIterator CVar10;
  LogicalIndex dependent;
  queue<duckdb::LogicalIndex,_std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
  to_visit;
  logical_index_set_t visited;
  key_type local_f8;
  ColumnList *local_f0;
  ColumnLogicalIteratorInternal local_e8;
  _Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> local_c8;
  ColumnList *local_70;
  undefined1 local_68 [40];
  __node_base local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).
  super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  local_70 = columns;
  ::std::_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::_M_initialize_map
            ((_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
             __return_storage_ptr__,0);
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::_M_initialize_map
            (&local_c8,0);
  local_68._0_8_ = &stack0xffffffffffffffc8;
  local_68._8_8_ = &DAT_00000001;
  local_68._16_8_ = (pointer)0x0;
  local_68._24_8_ = (__buckets_ptr)0x0;
  local_68._32_4_ = 1.0;
  local_40._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_f0 = (ColumnList *)&this->direct_dependencies;
  p_Var8 = (this->direct_dependencies)._M_h._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      local_f8.index = (idx_t)p_Var8[1]._M_nxt;
      p_Var4 = ::std::
               _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,local_f8.index % (this->dependencies_map)._M_h._M_bucket_count,
                          &local_f8,local_f8.index);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        pLVar1 = (__return_storage_ptr__->c).
                 super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pLVar1 == (__return_storage_ptr__->c).
                      super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
          _M_push_back_aux<duckdb::LogicalIndex_const&>
                    ((deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)
                     __return_storage_ptr__,&local_f8);
        }
        else {
          pLVar1->index = local_f8.index;
          (__return_storage_ptr__->c).
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = pLVar1 + 1;
        }
        local_e8.list = (ColumnList *)local_68;
        ::std::
        _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::LogicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalIndex,true>>>>
                  ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_e8.list,&local_f8,&local_e8);
        pmVar5 = ::std::__detail::
                 _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_f0,&local_f8);
        for (p_Var7 = (pmVar5->_M_h)._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
            p_Var7 = p_Var7->_M_nxt) {
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
            _M_push_back_aux<duckdb::LogicalIndex_const&>
                      ((deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)&local_c8
                       ,(LogicalIndex *)(p_Var7 + 1));
          }
          else {
            (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->index =
                 (idx_t)p_Var7[1]._M_nxt;
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      local_f8.index = (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur)->index;
      if (local_c8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_c8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_c8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      p_Var4 = ::std::
               _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_f0,
                          local_f8.index % (this->direct_dependencies)._M_h._M_bucket_count,
                          &local_f8,local_f8.index);
      if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
        pLVar1 = (__return_storage_ptr__->c).
                 super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pLVar1 == (__return_storage_ptr__->c).
                      super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
          _M_push_back_aux<duckdb::LogicalIndex_const&>
                    ((deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)
                     __return_storage_ptr__,&local_f8);
        }
        else {
          pLVar1->index = local_f8.index;
          (__return_storage_ptr__->c).
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = pLVar1 + 1;
        }
        local_e8.list = (ColumnList *)local_68;
        ::std::
        _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<duckdb::LogicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalIndex,true>>>>
                  ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_68,&local_f8,&local_e8);
        pmVar5 = ::std::__detail::
                 _Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_f0,&local_f8);
        for (p_Var8 = (pmVar5->_M_h)._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
            p_Var8 = p_Var8->_M_nxt) {
          if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>>::
            _M_push_back_aux<duckdb::LogicalIndex_const&>
                      ((deque<duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>> *)&local_c8
                       ,(LogicalIndex *)(p_Var8 + 1));
          }
          else {
            (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur)->index =
                 (idx_t)p_Var8[1]._M_nxt;
            local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  CVar10 = ColumnList::Logical(local_70);
  local_f0 = CVar10.list;
  local_e8.physical = CVar10.physical;
  if (((undefined1  [16])CVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar2 = (local_f0->columns).
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_e8.end = ((long)pCVar2 -
                    (long)(local_f0->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    iVar9 = ((long)pCVar2 -
             (long)(local_f0->columns).
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   .
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    iVar9 = (long)(local_f0->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(local_f0->physical_columns).
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_e8.end = iVar9;
  }
  local_e8.pos = 0;
  local_e8.list = local_f0;
  while (((local_e8.pos != iVar9 || (local_e8.end != iVar9)) || (local_e8.list != local_f0))) {
    this_00 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*(&local_e8);
    bVar3 = ColumnDefinition::Generated(this_00);
    if (bVar3) {
      local_f8.index = (idx_t)ColumnDefinition::Logical(this_00);
      sVar6 = ::std::
              _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_68,&local_f8);
      if (sVar6 == 0) {
        local_f8.index = (idx_t)ColumnDefinition::Logical(this_00);
        pLVar1 = (__return_storage_ptr__->c).
                 super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pLVar1 == (__return_storage_ptr__->c).
                      super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::deque<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
          _M_push_back_aux<duckdb::LogicalIndex>(&__return_storage_ptr__->c,&local_f8);
        }
        else {
          pLVar1->index = local_f8.index;
          (__return_storage_ptr__->c).
          super__Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = pLVar1 + 1;
        }
      }
    }
    local_e8.pos = local_e8.pos + 1;
  }
  ::std::
  _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  ::std::_Deque_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::~_Deque_base
            (&local_c8);
  return __return_storage_ptr__;
}

Assistant:

stack<LogicalIndex> ColumnDependencyManager::GetBindOrder(const ColumnList &columns) {
	stack<LogicalIndex> bind_order;
	queue<LogicalIndex> to_visit;
	logical_index_set_t visited;

	for (auto &entry : direct_dependencies) {
		auto dependent = entry.first;
		//! Skip the dependents that are also dependencies
		if (dependencies_map.find(dependent) != dependencies_map.end()) {
			continue;
		}
		bind_order.push(dependent);
		visited.insert(dependent);
		for (auto &dependency : direct_dependencies[dependent]) {
			to_visit.push(dependency);
		}
	}

	while (!to_visit.empty()) {
		auto column = to_visit.front();
		to_visit.pop();

		//! If this column does not have dependencies, the queue stops getting filled
		if (direct_dependencies.find(column) == direct_dependencies.end()) {
			continue;
		}
		bind_order.push(column);
		visited.insert(column);

		for (auto &dependency : direct_dependencies[column]) {
			to_visit.push(dependency);
		}
	}

	// Add generated columns that have no dependencies, but still might need to have their type resolved
	for (auto &col : columns.Logical()) {
		// Not a generated column
		if (!col.Generated()) {
			continue;
		}
		// Already added to the bind_order stack
		if (visited.count(col.Logical())) {
			continue;
		}
		bind_order.push(col.Logical());
	}

	return bind_order;
}